

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O1

void iutest::detail::PrintToChar<signed_char>(char value,iu_ostream *os)

{
  char cVar1;
  ushort *puVar2;
  size_t sVar3;
  ostream *poVar4;
  long lVar5;
  uint uVar6;
  char cVar7;
  char str [2];
  ushort local_4c;
  undefined1 local_4a;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  if (value != '\0') {
    if (value < ' ') {
      std::__ostream_insert<char,std::char_traits<char>>(os,"0x",2);
      puVar2 = &local_4c;
      local_4c = 0;
      lVar5 = 4;
      do {
        uVar6 = (int)value >> ((byte)lVar5 & 0x1f) & 0xf;
        cVar1 = (char)uVar6;
        cVar7 = cVar1 + '0';
        if (9 < uVar6) {
          cVar7 = cVar1 + '7';
        }
        *(char *)puVar2 = cVar7;
        puVar2 = (ushort *)((long)puVar2 + 1);
        lVar5 = lVar5 + -4;
      } while (lVar5 == 0);
      local_4a = 0;
      local_48 = local_38;
      sVar3 = strlen((char *)&local_4c);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,&local_4c,(long)&local_4c + sVar3);
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_48,local_40);
    }
    else {
      local_4c = (ushort)(byte)value;
      std::__ostream_insert<char,std::char_traits<char>>(os,"\'",1);
      local_48 = local_38;
      sVar3 = strlen((char *)&local_4c);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,&local_4c,(long)&local_4c + sVar3);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_48,local_40);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'",1);
    }
    if (local_48 != local_38) {
      operator_delete(local_48,local_38[0] + 1);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\\0",2);
  return;
}

Assistant:

void PrintToChar(const T value, iu_ostream* os)
{
    // char or unsigned char の時に、 0 が NULL 文字にならないように修正
    if( value == 0 )
    {
        *os << "\\0";
    }
    else if( static_cast<int>(value) < 0x20 )
    {
        *os << "0x" << ToHexString(value);
    }
    else
    {
        const T str[2] = { value, 0 };
        *os << "\'" << detail::ShowAnyCString(str) << "\'";
    }
}